

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O2

TestSuite * iuutil::FindTestSuite(char *testsuite_name)

{
  int iVar1;
  int iVar2;
  TestSuite *pTVar3;
  int index;
  
  pTVar3 = (TestSuite *)0x0;
  if (testsuite_name != (char *)0x0) {
    iVar1 = GetTotalTestSuiteCount();
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    index = 0;
    do {
      if (iVar1 == index) {
        return (TestSuite *)0x0;
      }
      pTVar3 = GetTestSuite(index);
      iVar2 = strcmp((pTVar3->m_testsuite_name)._M_dataplus._M_p,testsuite_name);
      index = index + 1;
    } while (iVar2 != 0);
  }
  return pTVar3;
}

Assistant:

inline const ::iutest::TestSuite* FindTestSuite(const char* testsuite_name)
{
    if( testsuite_name == NULL )
    {
        return NULL;
    }
    const int testsuite_count = ::iuutil::GetTotalTestSuiteCount();
    for( int i=0; i < testsuite_count; ++i )
    {
        const ::iutest::TestSuite* testsuite = ::iuutil::GetTestSuite(i);
        if( strcmp(testsuite->name(), testsuite_name) == 0 )
        {
            return testsuite;
        }
    }
    return NULL;
}